

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O0

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
IndexManager::FindSuchKey
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          IndexManager *this,STMT *S,TableInfo *T)

{
  int *this_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  BpTree<int> *this_01;
  BpTree<float> *this_02;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_03;
  reference pAVar4;
  _Self local_680;
  _Self local_678;
  _Self local_670;
  _Base_ptr local_668;
  _Rb_tree_const_iterator<Addr> local_660;
  iterator it;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_638;
  string local_608 [32];
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_5e8;
  string local_5b8 [32];
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_598;
  string local_568 [32];
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_548;
  string local_518 [32];
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_4f8;
  string local_4c8 [32];
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_4a8;
  string local_478 [32];
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_458;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *Tree_2;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_420;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_3f0;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_3c0;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_390;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_360;
  string local_330 [32];
  BpTree<float> *local_310;
  BpTree<float> *Tree_1;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_2d8;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_2a8;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_278;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_248;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> local_218;
  string local_1e8 [32];
  BpTree<int> *local_1c8;
  BpTree<int> *Tree;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  iterator temp;
  int IndexColumn;
  undefined1 local_120 [8];
  condition C;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> temp2;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> temp1;
  int local_50;
  int local_4c;
  int count;
  int i;
  string filename;
  TableInfo *T_local;
  STMT *S_local;
  IndexManager *this_local;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ans;
  
  std::__cxx11::string::string((string *)&count);
  local_50 = 0;
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set(__return_storage_ptr__);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set
            ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
             &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set
            ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&C.key.intV);
  for (local_4c = 0; sVar2 = std::vector<condition,_std::allocator<condition>_>::size(S->c_list),
      (ulong)(long)local_4c < sVar2; local_4c = local_4c + 1) {
    pvVar3 = std::vector<condition,_std::allocator<condition>_>::at(S->c_list,(long)local_4c);
    condition::condition((condition *)local_120,pvVar3);
    if ((C._32_1_ & 1) != 0) {
      this_00 = &C.key.intV;
      std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::clear
                ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)this_00);
      std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)this_00,__return_storage_ptr__
                );
      std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::clear(__return_storage_ptr__);
      std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::clear
                ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                 &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count);
      temp._M_node._4_4_ = local_120._0_4_;
      local_140._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&T->indexInfo,(key_type *)((long)&temp._M_node + 4));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Tree,
                     &this->Direction);
      std::operator+(local_1a0,(char *)&Tree);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_140);
      std::operator+(local_180,local_1a0);
      std::operator+(local_160,(char *)local_180);
      std::__cxx11::string::operator=((string *)&count,(string *)local_160);
      std::__cxx11::string::~string((string *)local_160);
      std::__cxx11::string::~string((string *)local_180);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)&Tree);
      if (C._36_4_ == 50000) {
        std::__cxx11::string::string(local_1e8,(string *)&count);
        this_01 = FindBpTree_I(this,(string *)local_1e8);
        std::__cxx11::string::~string(local_1e8);
        local_1c8 = this_01;
        switch(C._40_4_) {
        case (BADTYPE)0x0:
          BpTree<int>::FindEQ(&local_218,this_01,C.key._32_4_);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_218);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_218);
          break;
        case (BADTYPE)0x1:
          BpTree<int>::FindGreater(&local_248,this_01,C.key._32_4_,true);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_248);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_248);
          break;
        case (BADTYPE)0x2:
          BpTree<int>::FindGreater(&local_278,this_01,C.key._32_4_,false);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_278);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_278);
          break;
        case (BADTYPE)0x3:
          BpTree<int>::FindLess(&local_2a8,this_01,C.key._32_4_,true);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_2a8);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_2a8);
          break;
        case (BADTYPE)0x4:
          BpTree<int>::FindLess(&local_2d8,this_01,C.key._32_4_,false);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_2d8);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_2d8);
          break;
        case (BADTYPE)0x5:
          BpTree<int>::FindNEQ
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&Tree_1,this_01,
                     C.key._32_4_);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&Tree_1);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&Tree_1);
        }
      }
      else if (C._36_4_ == 90000) {
        std::__cxx11::string::string(local_330,(string *)&count);
        this_02 = FindBpTree_F(this,(string *)local_330);
        std::__cxx11::string::~string(local_330);
        local_310 = this_02;
        switch(C._40_4_) {
        case (BADTYPE)0x0:
          BpTree<float>::FindEQ(&local_360,this_02,(float)C.key._36_4_);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_360);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_360);
          break;
        case (BADTYPE)0x1:
          BpTree<float>::FindGreater(&local_390,this_02,(float)C.key._36_4_,true);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_390);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_390);
          break;
        case (BADTYPE)0x2:
          BpTree<float>::FindGreater(&local_3c0,this_02,(float)C.key._36_4_,false);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_3c0);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_3c0);
          break;
        case (BADTYPE)0x3:
          BpTree<float>::FindLess(&local_3f0,this_02,(float)C.key._36_4_,true);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_3f0);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_3f0);
          break;
        case (BADTYPE)0x4:
          BpTree<float>::FindLess(&local_420,this_02,(float)C.key._36_4_,false);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_420);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_420);
          break;
        case (BADTYPE)0x5:
          BpTree<float>::FindNEQ
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&Tree_2,this_02,
                     (float)C.key._36_4_);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&Tree_2);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&Tree_2);
        }
      }
      else if (120000 < (int)C._36_4_) {
        std::__cxx11::string::string(local_478,(string *)&count);
        this_03 = FindBpTree_S(this,(string *)local_478);
        std::__cxx11::string::~string(local_478);
        local_458 = this_03;
        switch(C._40_4_) {
        case (BADTYPE)0x0:
          std::__cxx11::string::string(local_4c8,(string *)&C.key);
          BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          FindEQ(&local_4a8,this_03,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_4a8);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_4a8);
          std::__cxx11::string::~string(local_4c8);
          break;
        case (BADTYPE)0x1:
          std::__cxx11::string::string(local_518,(string *)&C.key);
          BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          FindGreater(&local_4f8,this_03,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518
                      ,true);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_4f8);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_4f8);
          std::__cxx11::string::~string(local_518);
          break;
        case (BADTYPE)0x2:
          std::__cxx11::string::string(local_568,(string *)&C.key);
          BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          FindGreater(&local_548,this_03,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568
                      ,false);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_548);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_548);
          std::__cxx11::string::~string(local_568);
          break;
        case (BADTYPE)0x3:
          std::__cxx11::string::string(local_5b8,(string *)&C.key);
          BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          FindLess(&local_598,this_03,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8,
                   true);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_598);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_598);
          std::__cxx11::string::~string(local_5b8);
          break;
        case (BADTYPE)0x4:
          std::__cxx11::string::string(local_608,(string *)&C.key);
          BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          FindLess(&local_5e8,this_03,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                   false);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_5e8);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_5e8);
          std::__cxx11::string::~string(local_608);
          break;
        case (BADTYPE)0x5:
          std::__cxx11::string::string((string *)&it,(string *)&C.key);
          BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          FindNEQ(&local_638,this_03,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                    ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                     &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_638);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(&local_638);
          std::__cxx11::string::~string((string *)&it);
        }
      }
      if (local_50 == 0) {
        std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::operator=
                  (__return_storage_ptr__,
                   (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                   &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        std::_Rb_tree_const_iterator<Addr>::_Rb_tree_const_iterator(&local_660);
        local_668 = (_Base_ptr)
                    std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::begin
                              ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                               &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count);
        local_660._M_node = local_668;
        while( true ) {
          local_670._M_node =
               (_Base_ptr)
               std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::end
                         ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
                          &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar1 = std::operator!=(&local_660,&local_670);
          if (!bVar1) break;
          pAVar4 = std::_Rb_tree_const_iterator<Addr>::operator*(&local_660);
          local_678._M_node =
               (_Base_ptr)
               std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::find
                         ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&C.key.intV,pAVar4);
          local_680._M_node =
               (_Base_ptr)
               std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::end
                         ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&C.key.intV);
          bVar1 = std::operator!=(&local_678,&local_680);
          if (bVar1) {
            pAVar4 = std::_Rb_tree_const_iterator<Addr>::operator*(&local_660);
            std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::insert
                      (__return_storage_ptr__,pAVar4);
          }
          std::_Rb_tree_const_iterator<Addr>::operator++(&local_660,0);
        }
      }
      local_50 = local_50 + 1;
    }
    condition::~condition((condition *)local_120);
  }
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set
            ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&C.key.intV);
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set
            ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
             &temp2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&count);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> IndexManager::FindSuchKey(STMT S, TableInfo T) {
    string filename;
    int i, count = 0;
    set<Addr> ans, temp1, temp2;
    for (i = 0; i < S.c_list->size(); i++) {
        condition C = S.c_list->at(i);
        if (!C.isIndex)
            continue;						//如果不是index的约束条件，略过
        //将当前结果传给temp2作为中间变量
        temp2.clear();
        temp2 = ans;
        ans.clear();
        temp1.clear();
        int IndexColumn = C.colunmID;
        map<int, string>::iterator temp = T.indexInfo.find(IndexColumn);
        filename = Direction + S.tableName + "_" + temp->second + "_idx.dat";
        if (C.type == 50000) {
            BpTree<int>& Tree = FindBpTree_I(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.intV);			break;
                case 1: temp1 = Tree.FindGreater(C.key.intV, true); break;
                case 2: temp1 = Tree.FindGreater(C.key.intV, false);break;
                case 3: temp1 = Tree.FindLess(C.key.intV, true);	break;
                case 4: temp1 = Tree.FindLess(C.key.intV, false);	break;
                case 5: temp1 = Tree.FindNEQ(C.key.intV);			break;
                default:break;
            }
        }
        else if (C.type == 90000) {
            BpTree<float>& Tree = FindBpTree_F(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.floatV);				break;
                case 1: temp1 = Tree.FindGreater(C.key.floatV, true);	break;
                case 2: temp1 = Tree.FindGreater(C.key.floatV, false);	break;
                case 3: temp1 = Tree.FindLess(C.key.floatV, true);		break;
                case 4: temp1 = Tree.FindLess(C.key.floatV, false);		break;
                case 5: temp1 = Tree.FindNEQ(C.key.floatV);				break;
                default:break;
            }
        }
        else if (C.type > 120000) {
            BpTree<string>& Tree = FindBpTree_S(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.charV);				break;
                case 1: temp1 = Tree.FindGreater(C.key.charV, true);	break;
                case 2: temp1 = Tree.FindGreater(C.key.charV, false);	break;
                case 3: temp1 = Tree.FindLess(C.key.charV, true);		break;
                case 4: temp1 = Tree.FindLess(C.key.charV, false);		break;
                case 5: temp1 = Tree.FindNEQ(C.key.charV);				break;
                default:
                    break;
            }
        }
        if (count == 0) {
            ans = temp1;				//如果是第一个条件，那么得到的结果无需跟temp2取交集
        }
        else {
            set<Addr>::iterator it;		//如果不是第一个条件，得到的结果需要跟之前的结果temp2取交集
            it = temp1.begin();
            while (it != temp1.end()) {
                if (temp2.find(*it) != temp2.end())
                    ans.insert(*it);
                it++;
            }
        }
        count++;						//对索引条件计数
    }
    return ans;
}